

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmain.c
# Opt level: O0

ebml_element *
EBML_ElementCreateUsingContext
          (void *AnyNode,uint8_t *PossibleId,int8_t IdLength,ebml_parser_context *Context,
          int *LowLevel,bool_t IsGlobalContext,bool_t bAllowDummy)

{
  bool_t bVar1;
  ebml_element *peVar2;
  undefined1 local_a0 [8];
  ebml_parser_context GlobalContext;
  ebml_context ContextGlobals;
  ebml_semantic *Semantic;
  ebml_element *Result;
  bool_t IsGlobalContext_local;
  int *LowLevel_local;
  ebml_parser_context *Context_local;
  int8_t IdLength_local;
  uint8_t *PossibleId_local;
  void *AnyNode_local;
  
  if (((Context == (ebml_parser_context *)0x0) || (Context->Context == (ebml_context *)0x0)) ||
     (Context->Context->Semantic == (ebml_semantic *)0x0)) {
    AnyNode_local = (void *)0x0;
  }
  else {
    for (ContextGlobals.GlobalContext = Context->Context->Semantic;
        (ContextGlobals.GlobalContext)->eClass != (ebml_context *)0x0;
        ContextGlobals.GlobalContext = ContextGlobals.GlobalContext + 1) {
      bVar1 = EBML_IdMatch(PossibleId,IdLength,(ContextGlobals.GlobalContext)->eClass->Id);
      if (bVar1 != 0) {
        peVar2 = EBML_ElementCreate(AnyNode,(ContextGlobals.GlobalContext)->eClass,0,
                                    Context->Profile);
        return peVar2;
      }
    }
    if (Context->Context->GlobalContext == (ebml_semantic *)0x0) {
      __assert_fail("Context->Context->GlobalContext != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmain.c"
                    ,0xff,
                    "ebml_element *EBML_ElementCreateUsingContext(void *, const uint8_t *, int8_t, const ebml_parser_context *, int *, bool_t, bool_t)"
                   );
    }
    if (Context->Context->GlobalContext == Context->Context->Semantic) {
      AnyNode_local = (void *)0x0;
    }
    else {
      local_a0 = (undefined1  [8])&GlobalContext.Profile;
      GlobalContext.UpContext = (ebml_parser_context *)0xffffffffffffffff;
      GlobalContext.EndPosition._0_4_ = Context->Profile;
      *LowLevel = *LowLevel + -1;
      GlobalContext.Context = (ebml_context *)Context;
      Semantic = (ebml_semantic *)
                 EBML_ElementCreateUsingContext
                           (AnyNode,PossibleId,IdLength,(ebml_parser_context *)local_a0,LowLevel,1,
                            bAllowDummy);
      AnyNode_local = Semantic;
      if ((ebml_element *)Semantic == (ebml_element *)0x0) {
        *LowLevel = *LowLevel + 1;
        if (Context->UpContext == (ebml_parser_context *)0x0) {
          if (((IsGlobalContext == 0) && (bAllowDummy != 0)) && (IdLength != '\0')) {
            *LowLevel = 0;
            Semantic = (ebml_semantic *)
                       CreateElement(AnyNode,PossibleId,IdLength,Context->Context,(ebml_master *)0x0
                                     ,Context->Profile);
          }
          AnyNode_local = Semantic;
        }
        else {
          *LowLevel = *LowLevel + 1;
          AnyNode_local =
               EBML_ElementCreateUsingContext
                         (AnyNode,PossibleId,IdLength,Context->UpContext,LowLevel,IsGlobalContext,
                          bAllowDummy);
        }
      }
    }
  }
  return (ebml_element *)AnyNode_local;
}

Assistant:

static ebml_element *EBML_ElementCreateUsingContext(void *AnyNode, const uint8_t *PossibleId, int8_t IdLength, const ebml_parser_context *Context,
                                                    int *LowLevel, bool_t IsGlobalContext, bool_t bAllowDummy)
{
//	unsigned int ContextIndex;
    ebml_element *Result = NULL;
    const ebml_semantic *Semantic;

    if (!Context || !Context->Context || !Context->Context->Semantic)
        return NULL;

    // elements at the current level
    for (Semantic=Context->Context->Semantic;Semantic->eClass;Semantic++)
    {
        if (EBML_IdMatch(PossibleId, IdLength, Semantic->eClass->Id)) // && (bAllowDummy || bAllowOutOfProfile || !(Context->Profile & Semantic->DisabledProfile)))
        {
            Result = EBML_ElementCreate(AnyNode,Semantic->eClass,0, Context->Profile);
            return Result;
        }
    }

    // global elements
    assert(Context->Context->GlobalContext != NULL); // global should always exist, at least the EBML ones
    if (Context->Context->GlobalContext == Context->Context->Semantic)
        return NULL;
    else
    {
        ebml_context ContextGlobals;
        ebml_parser_context GlobalContext;

        ContextGlobals.Semantic = Context->Context->GlobalContext;
        ContextGlobals.GlobalContext = Context->Context->GlobalContext;

        GlobalContext.Context = &ContextGlobals;
        GlobalContext.UpContext = Context;
        GlobalContext.EndPosition = INVALID_FILEPOS_T;
        GlobalContext.Profile = Context->Profile;
        (*LowLevel)--;
        // recursive is good, but be carefull...
        Result = EBML_ElementCreateUsingContext(AnyNode,PossibleId,IdLength,&GlobalContext,LowLevel,1,bAllowDummy);
        if (Result)
            return Result;
        (*LowLevel)++;
    }

#ifdef TODO
    // parent elements
    if (Context.MasterElt != NULL && aID == Context.MasterElt->GlobalId) {
        (*LowLevel)++; // already one level up (same as context)
        return &Context.MasterElt->Create();
    }
#endif

    // check wether it's not part of an upper context
    if (Context->UpContext != NULL) {
        (*LowLevel)++;
        return EBML_ElementCreateUsingContext(AnyNode, PossibleId, IdLength, Context->UpContext, LowLevel, IsGlobalContext, bAllowDummy);
    }

    // dummy fallback
    if (!IsGlobalContext && bAllowDummy && IdLength!=0) {
        (*LowLevel) = 0;
        Result = CreateElement(AnyNode,PossibleId,IdLength,Context->Context,NULL, Context->Profile);
    }

    return Result;
}